

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

int scroll_indicator_pos_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  long lVar5;
  long val_1;
  long val_2;
  float fVar6;
  float val_1_00;
  float val_2_00;
  undefined1 local_70 [8];
  Am_Value value_2;
  Am_Value value_1;
  Am_Value value_v;
  int maxpos;
  int minpos;
  Am_Object local_28;
  Am_Object scroll_bar;
  int return_val;
  Am_Object *self_local;
  
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&local_28,0x1b2,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&local_28,0x1b3,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    Am_Value::Am_Value((Am_Value *)&value_1.value);
    Am_Value::Am_Value((Am_Value *)&value_2.value);
    Am_Value::Am_Value((Am_Value *)local_70);
    pAVar4 = Am_Object::Get(&local_28,0x169,0);
    Am_Value::operator=((Am_Value *)&value_1.value,pAVar4);
    pAVar4 = Am_Object::Get(&local_28,0x181,0);
    Am_Value::operator=((Am_Value *)&value_2.value,pAVar4);
    pAVar4 = Am_Object::Get(&local_28,0x182,0);
    Am_Value::operator=((Am_Value *)local_70,pAVar4);
    if (((value_1.value.long_value._0_2_ == 2) && (value_2.value.long_value._0_2_ == 2)) &&
       (local_70._0_2_ == 2)) {
      lVar5 = Am_Value::operator_cast_to_long((Am_Value *)&value_1.value);
      val_1 = Am_Value::operator_cast_to_long((Am_Value *)&value_2.value);
      val_2 = Am_Value::operator_cast_to_long((Am_Value *)local_70);
      lVar5 = Am_Clip_And_Map(lVar5,val_1,val_2,(long)iVar2,(long)iVar3);
      scroll_bar.data._4_4_ = (int)lVar5;
    }
    else {
      fVar6 = Am_Value::operator_cast_to_float((Am_Value *)&value_1.value);
      val_1_00 = Am_Value::operator_cast_to_float((Am_Value *)&value_2.value);
      val_2_00 = Am_Value::operator_cast_to_float((Am_Value *)local_70);
      fVar6 = Am_Clip_And_Map(fVar6,val_1_00,val_2_00,(float)iVar2,(float)iVar3);
      scroll_bar.data._4_4_ = (int)fVar6;
    }
    self_local._4_4_ = scroll_bar.data._4_4_;
    Am_Value::~Am_Value((Am_Value *)local_70);
    Am_Value::~Am_Value((Am_Value *)&value_2.value);
    Am_Value::~Am_Value((Am_Value *)&value_1.value);
  }
  else {
    self_local._4_4_ = 10;
  }
  Am_Object::~Am_Object(&local_28);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, scroll_indicator_pos)
{
  int return_val;
  Am_Object scroll_bar = self.Get_Owner();
  if (!scroll_bar.Valid())
    return 10;
  int minpos = scroll_bar.Get(Am_SCROLL_AREA_MIN);
  int maxpos = scroll_bar.Get(Am_SCROLL_AREA_MAX);
  Am_Value value_v;
  Am_Value value_1;
  Am_Value value_2;
  value_v = scroll_bar.Get(Am_VALUE);
  value_1 = scroll_bar.Get(Am_VALUE_1);
  value_2 = scroll_bar.Get(Am_VALUE_2);

  if (value_v.type == Am_INT && value_1.type == Am_INT &&
      value_2.type == Am_INT)
    return_val =
        (int)Am_Clip_And_Map((long)value_v, (long)value_1, (long)value_2,
                             (long)minpos, (long)maxpos);
  else // calc in float and then convert result to integers
    return_val =
        (int)Am_Clip_And_Map((float)value_v, (float)value_1, (float)value_2,
                             (float)minpos, (float)maxpos);
  return return_val;
}